

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
              (uint64_t param_1,score_iterator *param_2,score_iterator *param_3,int *param_4)

{
  bool bVar1;
  float *pfVar2;
  float fVar3;
  score_iterator pdf_1;
  uint32_t i;
  float sum;
  bool index_found;
  float draw;
  score_iterator pdf;
  float total;
  score_iterator local_60;
  int local_50;
  float local_4c;
  byte local_45;
  float local_44;
  score_iterator local_40;
  float local_2c;
  int *local_28;
  score_iterator *local_20;
  score_iterator *local_18;
  uint64_t local_10;
  
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  bVar1 = ACTION_SCORE::score_iterator::operator==(param_2,param_3);
  if ((bVar1) || (bVar1 = ACTION_SCORE::score_iterator::operator<(param_3,param_2), bVar1)) {
    return 1;
  }
  local_2c = 0.0;
  ACTION_SCORE::score_iterator::score_iterator(&local_40,param_2);
  while (bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_40,param_3), local_44 = local_2c,
        bVar1) {
    pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_40);
    if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
      pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_40);
      *pfVar2 = 0.0;
    }
    pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_40);
    local_2c = *pfVar2 + local_2c;
    ACTION_SCORE::score_iterator::operator++(&local_40);
  }
  if ((local_2c == 0.0) && (!NAN(local_2c))) {
    *local_28 = 0;
    pfVar2 = ACTION_SCORE::score_iterator::operator*(param_2);
    *pfVar2 = 1.0;
    return 0;
  }
  fVar3 = uniform_random_merand48(local_10);
  local_44 = local_44 * fVar3;
  if (local_2c < local_44) {
    local_44 = local_2c;
  }
  local_45 = 0;
  local_4c = 0.0;
  local_50 = 0;
  ACTION_SCORE::score_iterator::score_iterator(&local_60,param_2);
  while (bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_60,param_3), bVar1) {
    pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_60);
    fVar3 = local_2c;
    local_4c = *pfVar2 + local_4c;
    if (((local_45 & 1) == 0) && (local_44 < local_4c)) {
      *local_28 = local_50;
      local_45 = 1;
    }
    pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_60);
    *pfVar2 = *pfVar2 / fVar3;
    ACTION_SCORE::score_iterator::operator++(&local_60);
    local_50 = local_50 + 1;
  }
  if ((local_45 & 1) == 0) {
    *local_28 = local_50 + -1;
  }
  return 0;
}

Assistant:

int sample_after_normalizing(uint64_t seed, It pdf_first, It pdf_last, uint32_t& chosen_index, std::input_iterator_tag /* pdf_category */)
  {
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;
    // Create a discrete_distribution based on the returned weights. This class handles the
    // case where the sum of the weights is < or > 1, by normalizing agains the sum.
    float total = 0.f;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf)
    {
      if (*pdf < 0)
        *pdf = 0;

      total += *pdf;
    }

    // assume the first is the best
    if (total == 0)
    {
      chosen_index = 0;
      *pdf_first = 1;
      return S_EXPLORATION_OK;
    }

    float draw = total * uniform_random_merand48(seed);
    if (draw > total) //make very sure that draw can not be greater than total.
      draw = total;

    bool index_found = false; //found chosen action
    float sum = 0.f;
    uint32_t i = 0;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf, ++i)
    {
      sum += *pdf;
      if (!index_found && sum > draw)
      {
        chosen_index = i;
        index_found = true;
      }
      *pdf /= total;
    }

    if(!index_found)
      chosen_index = i - 1;

    return S_EXPLORATION_OK;
  }